

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O3

psa_status_t psa_destroy_persistent_key(psa_key_file_id_t key)

{
  ulong uid;
  psa_status_t pVar1;
  psa_status_t pVar2;
  psa_storage_info_t data_identifier_info;
  psa_storage_info_t local_10;
  
  uid = (ulong)key;
  pVar1 = psa_its_get_info(uid,&local_10);
  pVar2 = 0;
  if (pVar1 != -0x8c) {
    pVar1 = psa_its_remove(uid);
    pVar2 = -0x92;
    if (pVar1 == 0) {
      pVar1 = psa_its_get_info(uid,&local_10);
      pVar2 = -0x92;
      if (pVar1 == -0x8c) {
        pVar2 = 0;
      }
    }
  }
  return pVar2;
}

Assistant:

psa_status_t psa_destroy_persistent_key( const psa_key_file_id_t key )
{
    psa_status_t ret;
    psa_storage_uid_t data_identifier = psa_its_identifier_of_slot( key );
    struct psa_storage_info_t data_identifier_info;

    ret = psa_its_get_info( data_identifier, &data_identifier_info );
    if( ret == PSA_ERROR_DOES_NOT_EXIST )
        return( PSA_SUCCESS );

    if( psa_its_remove( data_identifier ) != PSA_SUCCESS )
        return( PSA_ERROR_STORAGE_FAILURE );

    ret = psa_its_get_info( data_identifier, &data_identifier_info );
    if( ret != PSA_ERROR_DOES_NOT_EXIST )
        return( PSA_ERROR_STORAGE_FAILURE );

    return( PSA_SUCCESS );
}